

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hevc.cpp
# Opt level: O0

string * __thiscall
HevcUnitWithProfile::getProfileString_abi_cxx11_
          (string *__return_storage_ptr__,HevcUnitWithProfile *this)

{
  uint local_16c;
  string local_168;
  allocator<char> local_141;
  string local_140 [36];
  uint local_11c;
  string local_118;
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [39];
  allocator<char> local_a1;
  string local_a0 [39];
  allocator<char> local_79;
  string local_78 [39];
  allocator<char> local_51;
  string local_50 [54];
  allocator<char> local_1a;
  undefined1 local_19;
  HevcUnitWithProfile *local_18;
  HevcUnitWithProfile *this_local;
  string *rez;
  
  local_19 = 0;
  local_18 = this;
  this_local = (HevcUnitWithProfile *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"Profile: ",&local_1a);
  std::allocator<char>::~allocator(&local_1a);
  if (this->profile_idc == '\x01') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_50,"Main",&local_51);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  else if (this->profile_idc == '\x02') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_78,"Main10",&local_79);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_78);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  else if (this->profile_idc == '\x03') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_a0,"MainStillPicture",&local_a1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a0);
    std::__cxx11::string::~string(local_a0);
    std::allocator<char>::~allocator(&local_a1);
  }
  else if (this->profile_idc == '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_c8,"Not defined",&local_c9);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  else {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"Unknown");
  }
  if (this->level_idc != '\0') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f0,"@",&local_f1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_f0);
    std::__cxx11::string::~string(local_f0);
    std::allocator<char>::~allocator(&local_f1);
    local_11c = this->level_idc / 0x1e;
    int32ToStr_abi_cxx11_(&local_118,(int32_t *)&local_11c);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_140,".",&local_141);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_140);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
    local_16c = ((uint)this->level_idc % 0x1e) / 3;
    int32ToStr_abi_cxx11_(&local_168,(int32_t *)&local_16c);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HevcUnitWithProfile::getProfileString() const
{
    string rez("Profile: ");
    if (profile_idc == 1)
        rez += string("Main");
    else if (profile_idc == 2)
        rez += string("Main10");
    else if (profile_idc == 3)
        rez += string("MainStillPicture");
    else if (profile_idc == 0)
        rez += string("Not defined");
    else
        rez += "Unknown";
    if (level_idc)
    {
        rez += string("@");
        rez += int32ToStr(level_idc / 30);
        rez += string(".");
        rez += int32ToStr((level_idc % 30) / 3);
    }
    return rez;
}